

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcActor::~IfcActor(IfcActor *this,void **vtt)

{
  void *pvVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  
  pvVar1 = *vtt;
  *(void **)&this->super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcObject).field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x12];
  *(void **)&(this->super_IfcObject).field_0x88 = vtt[0x13];
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x14];
  *(void **)&(this->super_IfcObject).field_0xd0 = vtt[0x15];
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0xe8 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0xe8);
  }
  pvVar1 = vtt[1];
  *(void **)&this->super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcObject).field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0xd];
  *(void **)&(this->super_IfcObject).field_0x88 = vtt[0xe];
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0xf];
  puVar3 = *(undefined1 **)
            &(this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
             field_0x10;
  puVar2 = &(this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
            field_0x20;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  pvVar1 = vtt[3];
  *(void **)&this->super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcObject).field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[6];
  puVar3 = *(undefined1 **)&(this->super_IfcObject).field_0x60;
  puVar2 = &(this->super_IfcObject).field_0x70;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  puVar3 = *(undefined1 **)&(this->super_IfcObject).field_0x38;
  puVar2 = &(this->super_IfcObject).field_0x48;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcObject).field_0x10;
  puVar3 = &(this->super_IfcObject).field_0x20;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
    return;
  }
  return;
}

Assistant:

IfcActor() : Object("IfcActor") {}